

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int write_skip(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,MB_MODE_INFO *mi,aom_writer *w)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (((cm->seg).enabled == '\0') || (((cm->seg).feature_mask[segment_id] & 0x40) == 0)) {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)xd->above_mbmi->skip_txfm;
    }
    uVar3 = (uint)mi->skip_txfm;
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)xd->left_mbmi->skip_txfm;
    }
    aom_write_symbol(w,(uint)mi->skip_txfm,xd->tile_ctx->skip_txfm_cdfs[uVar2 + uVar1],2);
  }
  else {
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

static int write_skip(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      uint8_t segment_id, const MB_MODE_INFO *mi,
                      aom_writer *w) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int skip_txfm = mi->skip_txfm;
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    aom_write_symbol(w, skip_txfm, ec_ctx->skip_txfm_cdfs[ctx], 2);
    return skip_txfm;
  }
}